

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int normal_prologTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  byte *pbVar7;
  uint uVar8;
  ATTRIBUTE *pAVar10;
  char **ppcVar11;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  char *extraout_RDX_10;
  char *extraout_RDX_11;
  char *extraout_RDX_12;
  char *extraout_RDX_13;
  long lVar12;
  int iVar13;
  char *pcVar14;
  char **ppcStack_40;
  uint uVar9;
  
  if (end <= ptr) {
    return -4;
  }
  bVar3 = false;
  iVar13 = 0;
  lVar12 = 1;
  ppcVar11 = (char **)0xfffffffffffffffe;
  iVar5 = 0x13;
  pbVar7 = (byte *)ptr;
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
  case 2:
    pbVar7 = (byte *)(ptr + 1);
    if ((byte *)end == pbVar7 || (long)end - (long)pbVar7 < 0) {
      return -1;
    }
    bVar2 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar7);
    switch(bVar2) {
    case 0xf:
      iVar5 = normal_scanPi(enc,ptr + 2,end,nextTokPtr);
      return iVar5;
    case 0x10:
      pbVar7 = (byte *)(ptr + 2);
      if ((byte *)end == pbVar7 || (long)end - (long)pbVar7 < 0) {
        return -1;
      }
      switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*pbVar7)) {
      case 0x14:
        *nextTokPtr = ptr + 3;
        return 0x21;
      case 0x16:
      case 0x18:
        pbVar7 = (byte *)(ptr + 3);
        pcVar14 = end + (-4 - (long)ptr);
LAB_004e3b59:
        if (pcVar14 == (char *)0xffffffffffffffff || (long)(pcVar14 + 1) < 0) {
          return -1;
        }
        bVar2 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar7);
        switch(bVar2) {
        case 0x15:
          break;
        case 0x16:
        case 0x18:
          goto switchD_004e3b86_caseD_16;
        case 0x17:
        case 0x19:
        case 0x1a:
        case 0x1b:
        case 0x1c:
        case 0x1d:
          goto switchD_004e3b86_caseD_17;
        case 0x1e:
          if (pcVar14 == (char *)0x0) {
            return -1;
          }
          uVar8 = (uint)*(byte *)((long)enc[1].scanners + (ulong)pbVar7[1]);
          if ((uVar8 < 0x1f) && ((0x40200600U >> (uVar8 & 0x1f) & 1) != 0))
          goto switchD_004e3b86_caseD_17;
          break;
        default:
          if (1 < bVar2 - 9) goto switchD_004e3b86_caseD_17;
        }
        *nextTokPtr = (char *)pbVar7;
        return 0x10;
      case 0x1b:
        iVar5 = normal_scanComment(enc,ptr + 3,end,nextTokPtr);
        return iVar5;
      }
      break;
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x17:
      break;
    case 0x16:
    case 0x18:
switchD_004e39ed_caseD_16:
      *nextTokPtr = ptr;
      return 0x1d;
    default:
      if ((bVar2 - 5 < 3) || (bVar2 == 0x1d)) goto switchD_004e39ed_caseD_16;
    }
    goto switchD_004e39ed_caseD_11;
  default:
    *nextTokPtr = ptr;
    break;
  case 4:
    pcVar14 = ptr + 1;
    if ((long)end - (long)pcVar14 < 1) {
      return -0x1a;
    }
    if (*pcVar14 == ']') {
      if ((long)end - (long)pcVar14 == 1) {
        return -1;
      }
      if (ptr[2] == '>') {
        *nextTokPtr = ptr + 3;
        return 0x22;
      }
    }
    *nextTokPtr = pcVar14;
    iVar13 = 0x1a;
    break;
  case 5:
    if ((long)end - (long)ptr < 2) {
      return -2;
    }
    iVar5 = (*enc[3].nameLength)(enc,ptr);
    if (iVar5 == 0) {
      iVar5 = (*enc[3].literalScanners[0])(enc,ptr,extraout_RDX_03,ppcVar11);
      lVar12 = 2;
      if (iVar5 == 0) {
        iVar13 = (*enc[3].scanners[0])(enc,ptr,extraout_RDX_04,ppcVar11);
        goto LAB_004e3ba3;
      }
LAB_004e3a30:
      bVar3 = false;
      iVar5 = 0x12;
      goto LAB_004e35a9;
    }
    goto switchD_004e3b86_caseD_17;
  case 6:
    if ((long)end - (long)ptr < 3) {
      return -2;
    }
    pcVar14 = (*enc[3].skipS)(enc,ptr);
    if ((int)pcVar14 != 0) goto switchD_004e3b86_caseD_17;
    iVar5 = (*enc[3].literalScanners[1])(enc,ptr,extraout_RDX_07,ppcVar11);
    lVar12 = 3;
    if (iVar5 != 0) goto LAB_004e3a30;
    iVar13 = (*enc[3].scanners[1])(enc,ptr,extraout_RDX_08,ppcVar11);
LAB_004e3ba3:
    bVar3 = true;
    iVar5 = 0x13;
    if (iVar13 != 0) goto LAB_004e35a9;
switchD_004e35e8_caseD_8:
    *nextTokPtr = ptr;
    goto LAB_004e3bbb;
  case 7:
    if ((long)end - (long)ptr < 4) {
      return -2;
    }
    iVar5 = (*enc[3].getAtts)(enc,ptr,(int)end,(ATTRIBUTE *)0xfffffffffffffffe);
    if (iVar5 == 0) {
      iVar5 = (*enc[3].nameMatchesAscii)(enc,ptr,extraout_RDX_05,(char *)ppcVar11);
      lVar12 = 4;
      if (iVar5 != 0) goto LAB_004e3a30;
      iVar13 = (*enc[3].scanners[2])(enc,ptr,extraout_RDX_06,ppcVar11);
      goto LAB_004e3ba3;
    }
switchD_004e3b86_caseD_17:
    *nextTokPtr = (char *)pbVar7;
    goto LAB_004e3bbb;
  case 9:
    if (ptr + 1 == end) {
      *nextTokPtr = end;
      return -0xf;
    }
  case 10:
  case 0x15:
    pcVar14 = end + ~(ulong)ptr;
    for (pbVar7 = (byte *)(ptr + 1);
        (0 < (long)pcVar14 &&
        (((cVar1 = *(char *)((long)enc[1].scanners + (ulong)*pbVar7), cVar1 == '\x15' ||
          (cVar1 == '\n')) || ((cVar1 == '\t' && (pbVar7 + 1 != (byte *)end))))));
        pbVar7 = pbVar7 + 1) {
      pcVar14 = pcVar14 + -1;
    }
    *nextTokPtr = (char *)pbVar7;
    iVar13 = 0xf;
    break;
  case 0xb:
    *nextTokPtr = ptr + 1;
    iVar13 = 0x11;
    break;
  case 0xc:
    ppcStack_40._0_4_ = 0xc;
    goto LAB_004e3923;
  case 0xd:
    ppcStack_40._0_4_ = 0xd;
LAB_004e3923:
    iVar5 = normal_scanLit((int)ppcStack_40,enc,ptr + 1,end,nextTokPtr);
    return iVar5;
  case 0x13:
    pbVar7 = (byte *)(ptr + 1);
    uVar6 = (long)end - (long)pbVar7;
    if ((long)uVar6 < 1) {
      return -1;
    }
    ppcStack_40 = (char **)0x4;
    bVar2 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar7);
    pAVar10 = (ATTRIBUTE *)(ulong)bVar2;
    iVar5 = 0;
    iVar13 = 0;
    ppcVar11 = (char **)&DAT_00000001;
    if (bVar2 == 0x18) goto LAB_004e3c1b;
    if (bVar2 == 6) {
      if (uVar6 < 3) {
        return -2;
      }
      pcVar14 = (*enc[3].skipS)(enc,(char *)pbVar7);
      if ((int)pcVar14 == 0) {
        iVar4 = (*enc[3].literalScanners[1])(enc,(char *)pbVar7,extraout_RDX_09,&pAVar10->name);
        ppcStack_40 = (char **)0x3;
LAB_004e3c13:
        ppcVar11 = ppcStack_40;
        iVar13 = iVar5;
        if (iVar4 != 0) {
LAB_004e3c1b:
          pbVar7 = pbVar7 + (long)ppcVar11;
LAB_004e3c28:
          uVar6 = (long)end - (long)pbVar7;
          if ((long)uVar6 < 1) {
            return -0x14;
          }
          uVar9 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*pbVar7);
          uVar8 = uVar9 - 5;
          if (0x1f < uVar8) goto switchD_004e3c5b_caseD_8;
          ppcStack_40 = (char **)&DAT_00000001;
          switch(uVar9) {
          case 5:
            if (uVar6 == 1) {
              return -2;
            }
            ppcVar11 = (char **)&DAT_00000001;
            iVar5 = (*enc[3].nameLength)(enc,(char *)pbVar7);
            if (iVar5 == 0) {
              iVar5 = (*enc[3].scanners[0])(enc,(char *)pbVar7,extraout_RDX_11,ppcVar11);
              ppcStack_40 = (char **)0x2;
LAB_004e3ce5:
              if (iVar5 != 0) goto switchD_004e3c5b_caseD_16;
            }
            break;
          case 6:
            if (uVar6 < 3) {
              return -2;
            }
            ppcVar11 = (char **)&DAT_00000001;
            pcVar14 = (*enc[3].skipS)(enc,(char *)pbVar7);
            if ((int)pcVar14 == 0) {
              iVar5 = (*enc[3].scanners[1])(enc,(char *)pbVar7,extraout_RDX_12,ppcVar11);
              ppcStack_40 = (char **)0x3;
              goto LAB_004e3ce5;
            }
            break;
          case 7:
            if (uVar6 < 4) {
              return -2;
            }
            ppcVar11 = (char **)&DAT_00000001;
            iVar5 = (*enc[3].getAtts)(enc,(char *)pbVar7,
                                      (&switchD_004e3c5b::switchdataD_00674e9c)[uVar8] + 0x674e9c,
                                      (ATTRIBUTE *)&DAT_00000001);
            if (iVar5 == 0) {
              iVar5 = (*enc[3].scanners[2])(enc,(char *)pbVar7,extraout_RDX_13,ppcVar11);
              ppcStack_40 = (char **)0x4;
              goto LAB_004e3ce5;
            }
            break;
          case 9:
          case 10:
          case 0xb:
          case 0x15:
          case 0x1e:
          case 0x20:
          case 0x24:
            iVar13 = 0x14;
            goto LAB_004e3cf9;
          case 0x16:
          case 0x18:
          case 0x19:
          case 0x1a:
          case 0x1b:
            goto switchD_004e3c5b_caseD_16;
          }
switchD_004e3c5b_caseD_8:
          iVar13 = 0;
        }
      }
    }
    else if (bVar2 == 7) {
      if (uVar6 < 4) {
        return -2;
      }
      iVar4 = (*enc[3].getAtts)(enc,(char *)pbVar7,1,pAVar10);
      if (iVar4 == 0) {
        iVar4 = (*enc[3].nameMatchesAscii)(enc,(char *)pbVar7,extraout_RDX_10,(char *)pAVar10);
        goto LAB_004e3c13;
      }
    }
    else {
      if (bVar2 == 0x16) goto LAB_004e3c1b;
      iVar13 = iVar5;
      if (bVar2 == 5) {
        if (uVar6 == 1) {
          return -2;
        }
        iVar4 = (*enc[3].nameLength)(enc,(char *)pbVar7);
        if (iVar4 == 0) {
          iVar4 = (*enc[3].literalScanners[0])(enc,(char *)pbVar7,extraout_RDX_02,&pAVar10->name);
          ppcStack_40 = (char **)0x2;
          goto LAB_004e3c13;
        }
      }
    }
LAB_004e3cf9:
    *nextTokPtr = (char *)pbVar7;
    break;
  case 0x14:
    *nextTokPtr = ptr + 1;
    iVar13 = 0x19;
    break;
  case 0x16:
  case 0x18:
    iVar5 = 0x12;
    goto LAB_004e35a9;
  case 0x19:
  case 0x1a:
  case 0x1b:
    bVar3 = true;
LAB_004e35a9:
    ptr = ptr + lVar12;
    while( true ) {
      ppcStack_40 = (char **)&DAT_00000001;
      uVar6 = (long)end - (long)ptr;
      if ((long)uVar6 < 1) break;
      uVar9 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
      uVar8 = uVar9 - 5;
      if (0x1f < uVar8) goto switchD_004e35e8_caseD_8;
      switch(uVar9) {
      case 5:
        if (uVar6 == 1) {
          return -2;
        }
        iVar13 = (*enc[3].nameLength)(enc,ptr);
        if (iVar13 != 0) goto switchD_004e35e8_caseD_8;
        iVar13 = (*enc[3].scanners[0])(enc,ptr,extraout_RDX,ppcStack_40);
        ppcStack_40 = (char **)0x2;
        break;
      case 6:
        if (uVar6 < 3) {
          return -2;
        }
        pcVar14 = (*enc[3].skipS)(enc,ptr);
        if ((int)pcVar14 != 0) goto switchD_004e35e8_caseD_8;
        iVar13 = (*enc[3].scanners[1])(enc,ptr,extraout_RDX_00,ppcStack_40);
        ppcStack_40 = (char **)0x3;
        break;
      case 7:
        if (uVar6 < 4) {
          return -2;
        }
        iVar13 = (*enc[3].getAtts)(enc,ptr,(&switchD_004e35e8::switchdataD_00674e1c)[uVar8] +
                                           0x674e1c,(ATTRIBUTE *)&DAT_00000001);
        if (iVar13 != 0) goto switchD_004e35e8_caseD_8;
        iVar13 = (*enc[3].scanners[2])(enc,ptr,extraout_RDX_01,ppcStack_40);
        ppcStack_40 = (char **)0x4;
        break;
      default:
        goto switchD_004e35e8_caseD_8;
      case 9:
      case 10:
      case 0xb:
      case 0x14:
      case 0x15:
      case 0x1e:
      case 0x20:
      case 0x23:
      case 0x24:
        *nextTokPtr = ptr;
        return iVar5;
      case 0xf:
        if (!bVar3) {
          *nextTokPtr = (char *)((byte *)ptr + 1);
          return 0x1e;
        }
        goto switchD_004e35e8_caseD_8;
      case 0x16:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
        goto switchD_004e35e8_caseD_16;
      case 0x21:
        if (!bVar3) {
          *nextTokPtr = (char *)((byte *)ptr + 1);
          return 0x1f;
        }
        goto switchD_004e35e8_caseD_8;
      case 0x22:
        if (!bVar3) {
          *nextTokPtr = (char *)((byte *)ptr + 1);
          return 0x20;
        }
        goto switchD_004e35e8_caseD_8;
      }
      if (iVar13 == 0) goto switchD_004e35e8_caseD_8;
switchD_004e35e8_caseD_16:
      ptr = (char *)((byte *)ptr + (long)ppcStack_40);
    }
    iVar13 = -iVar5;
    break;
  case 0x1e:
    iVar5 = normal_scanPercent(enc,ptr + 1,end,nextTokPtr);
    return iVar5;
  case 0x1f:
    *nextTokPtr = ptr + 1;
    iVar13 = 0x17;
    break;
  case 0x20:
    pbVar7 = (byte *)(ptr + 1);
    if ((byte *)end == pbVar7 || (long)end - (long)pbVar7 < 0) {
      return -0x18;
    }
    bVar2 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar7);
    switch(bVar2) {
    case 0x20:
    case 0x23:
    case 0x24:
switchD_004e3a07_caseD_20:
      *nextTokPtr = (char *)pbVar7;
      return 0x18;
    case 0x21:
      *nextTokPtr = ptr + 2;
      return 0x24;
    case 0x22:
      *nextTokPtr = ptr + 2;
      return 0x25;
    default:
      if (bVar2 - 9 < 3) goto switchD_004e3a07_caseD_20;
    }
    if (bVar2 == 0xf) {
      *nextTokPtr = ptr + 2;
      return 0x23;
    }
    if (bVar2 == 0x15) goto switchD_004e3a07_caseD_20;
switchD_004e39ed_caseD_11:
    *nextTokPtr = (char *)pbVar7;
LAB_004e3bbb:
    iVar13 = 0;
    break;
  case 0x23:
    *nextTokPtr = ptr + 1;
    iVar13 = 0x26;
    break;
  case 0x24:
    *nextTokPtr = ptr + 1;
    iVar13 = 0x15;
  }
  return iVar13;
switchD_004e3c5b_caseD_16:
  pbVar7 = pbVar7 + (long)ppcStack_40;
  goto LAB_004e3c28;
switchD_004e3b86_caseD_16:
  pbVar7 = pbVar7 + 1;
  pcVar14 = pcVar14 + -1;
  goto LAB_004e3b59;
}

Assistant:

static int PTRCALL
PREFIX(prologTok)(const ENCODING *enc, const char *ptr, const char *end,
                  const char **nextTokPtr) {
  int tok;
  if (ptr >= end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_QUOT:
    return PREFIX(scanLit)(BT_QUOT, enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_APOS:
    return PREFIX(scanLit)(BT_APOS, enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_LT: {
    ptr += MINBPC(enc);
    REQUIRE_CHAR(enc, ptr, end);
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_EXCL:
      return PREFIX(scanDecl)(enc, ptr + MINBPC(enc), end, nextTokPtr);
    case BT_QUEST:
      return PREFIX(scanPi)(enc, ptr + MINBPC(enc), end, nextTokPtr);
    case BT_NMSTRT:
    case BT_HEX:
    case BT_NONASCII:
    case BT_LEAD2:
    case BT_LEAD3:
    case BT_LEAD4:
      *nextTokPtr = ptr - MINBPC(enc);
      return XML_TOK_INSTANCE_START;
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  case BT_CR:
    if (ptr + MINBPC(enc) == end) {
      *nextTokPtr = end;
      /* indicate that this might be part of a CR/LF pair */
      return -XML_TOK_PROLOG_S;
    }
    /* fall through */
  case BT_S:
  case BT_LF:
    for (;;) {
      ptr += MINBPC(enc);
      if (! HAS_CHAR(enc, ptr, end))
        break;
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_S:
      case BT_LF:
        break;
      case BT_CR:
        /* don't split CR/LF pair */
        if (ptr + MINBPC(enc) != end)
          break;
        /* fall through */
      default:
        *nextTokPtr = ptr;
        return XML_TOK_PROLOG_S;
      }
    }
    *nextTokPtr = ptr;
    return XML_TOK_PROLOG_S;
  case BT_PERCNT:
    return PREFIX(scanPercent)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_COMMA:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_COMMA;
  case BT_LSQB:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OPEN_BRACKET;
  case BT_RSQB:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return -XML_TOK_CLOSE_BRACKET;
    if (CHAR_MATCHES(enc, ptr, ASCII_RSQB)) {
      REQUIRE_CHARS(enc, ptr, end, 2);
      if (CHAR_MATCHES(enc, ptr + MINBPC(enc), ASCII_GT)) {
        *nextTokPtr = ptr + 2 * MINBPC(enc);
        return XML_TOK_COND_SECT_CLOSE;
      }
    }
    *nextTokPtr = ptr;
    return XML_TOK_CLOSE_BRACKET;
  case BT_LPAR:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OPEN_PAREN;
  case BT_RPAR:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return -XML_TOK_CLOSE_PAREN;
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_AST:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_ASTERISK;
    case BT_QUEST:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_QUESTION;
    case BT_PLUS:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_PLUS;
    case BT_CR:
    case BT_LF:
    case BT_S:
    case BT_GT:
    case BT_COMMA:
    case BT_VERBAR:
    case BT_RPAR:
      *nextTokPtr = ptr;
      return XML_TOK_CLOSE_PAREN;
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  case BT_VERBAR:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OR;
  case BT_GT:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DECL_CLOSE;
  case BT_NUM:
    return PREFIX(scanPoundName)(enc, ptr + MINBPC(enc), end, nextTokPtr);
#  define LEAD_CASE(n)                                                         \
  case BT_LEAD##n:                                                             \
    if (end - ptr < n)                                                         \
      return XML_TOK_PARTIAL_CHAR;                                             \
    if (IS_INVALID_CHAR(enc, ptr, n)) {                                        \
      *nextTokPtr = ptr;                                                       \
      return XML_TOK_INVALID;                                                  \
    }                                                                          \
    if (IS_NMSTRT_CHAR(enc, ptr, n)) {                                         \
      ptr += n;                                                                \
      tok = XML_TOK_NAME;                                                      \
      break;                                                                   \
    }                                                                          \
    if (IS_NAME_CHAR(enc, ptr, n)) {                                           \
      ptr += n;                                                                \
      tok = XML_TOK_NMTOKEN;                                                   \
      break;                                                                   \
    }                                                                          \
    *nextTokPtr = ptr;                                                         \
    return XML_TOK_INVALID;
    LEAD_CASE(2)
    LEAD_CASE(3)
    LEAD_CASE(4)
#  undef LEAD_CASE
  case BT_NMSTRT:
  case BT_HEX:
    tok = XML_TOK_NAME;
    ptr += MINBPC(enc);
    break;
  case BT_DIGIT:
  case BT_NAME:
  case BT_MINUS:
#  ifdef XML_NS
  case BT_COLON:
#  endif
    tok = XML_TOK_NMTOKEN;
    ptr += MINBPC(enc);
    break;
  case BT_NONASCII:
    if (IS_NMSTRT_CHAR_MINBPC(enc, ptr)) {
      ptr += MINBPC(enc);
      tok = XML_TOK_NAME;
      break;
    }
    if (IS_NAME_CHAR_MINBPC(enc, ptr)) {
      ptr += MINBPC(enc);
      tok = XML_TOK_NMTOKEN;
      break;
    }
    /* fall through */
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_GT:
    case BT_RPAR:
    case BT_COMMA:
    case BT_VERBAR:
    case BT_LSQB:
    case BT_PERCNT:
    case BT_S:
    case BT_CR:
    case BT_LF:
      *nextTokPtr = ptr;
      return tok;
#  ifdef XML_NS
    case BT_COLON:
      ptr += MINBPC(enc);
      switch (tok) {
      case XML_TOK_NAME:
        REQUIRE_CHAR(enc, ptr, end);
        tok = XML_TOK_PREFIXED_NAME;
        switch (BYTE_TYPE(enc, ptr)) {
          CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
        default:
          tok = XML_TOK_NMTOKEN;
          break;
        }
        break;
      case XML_TOK_PREFIXED_NAME:
        tok = XML_TOK_NMTOKEN;
        break;
      }
      break;
#  endif
    case BT_PLUS:
      if (tok == XML_TOK_NMTOKEN) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_PLUS;
    case BT_AST:
      if (tok == XML_TOK_NMTOKEN) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_ASTERISK;
    case BT_QUEST:
      if (tok == XML_TOK_NMTOKEN) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_QUESTION;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return -tok;
}